

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

int handle_subfields(FFSBuffer buf,FMFormat_conflict f,estate s,size_t data_offset)

{
  int iVar1;
  long lVar2;
  FMTypeDesc *t;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if ((f->variant != 0) && (0 < f->field_count)) {
    lVar2 = 0x14;
    lVar4 = 0x20;
    lVar3 = 0;
    do {
      t = (FMTypeDesc *)((long)&f->var_list->string + lVar4);
      iVar1 = field_is_flat(f,t);
      bVar5 = false;
      if (iVar1 == 0) {
        iVar1 = handle_subfield(buf,f,s,(long)*(int *)((long)&f->field_list->field_name + lVar2) +
                                        data_offset,data_offset,t);
        bVar5 = iVar1 != 1;
      }
      if (bVar5) {
        return 0;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
      lVar4 = lVar4 + 0x40;
    } while (lVar3 < f->field_count);
  }
  return 1;
}

Assistant:

static int
handle_subfields(FFSBuffer buf, FMFormat f, estate s, size_t data_offset)
{
    int i;
    /* if base is not variant (I.E. doesn't contain addresses), return;*/
    if (!f->variant) return 1;

    for (i = 0; i < f->field_count; i++) {
	size_t subfield_offset = data_offset + f->field_list[i].field_offset;
	int ret;
	if (field_is_flat(f, &f->var_list[i].type_desc)) continue;
	ret = handle_subfield(buf, f, s, subfield_offset, data_offset, 
			      &f->var_list[i].type_desc);
	if (ret != 1) return 0;
    }
    return 1;
}